

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O2

Vector2 GetMonitorPosition(int monitor)

{
  Vector2 VVar1;
  GLFWmonitor **ppGVar2;
  float fVar3;
  float fVar4;
  int monitorCount;
  int y;
  int x;
  
  monitorCount = 0;
  ppGVar2 = glfwGetMonitors(&monitorCount);
  if ((monitor < 0) || (monitorCount <= monitor)) {
    TraceLog(4,"GLFW: Failed to find selected monitor");
    fVar3 = 0.0;
    fVar4 = 0.0;
  }
  else {
    glfwGetMonitorPos(ppGVar2[(uint)monitor],&x,&y);
    fVar3 = (float)x;
    fVar4 = (float)y;
  }
  VVar1.y = fVar4;
  VVar1.x = fVar3;
  return VVar1;
}

Assistant:

Vector2 GetMonitorPosition(int monitor)
{
    int monitorCount = 0;
    GLFWmonitor **monitors = glfwGetMonitors(&monitorCount);

    if ((monitor >= 0) && (monitor < monitorCount))
    {
        int x, y;
        glfwGetMonitorPos(monitors[monitor], &x, &y);

        return (Vector2){ (float)x, (float)y };
    }
    else TRACELOG(LOG_WARNING, "GLFW: Failed to find selected monitor");
    return (Vector2){ 0, 0 };
}